

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void vli_modAdd(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod)

{
  ulong *puVar1;
  ulong uVar2;
  wordcount_t i;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  lVar4 = 0;
  uVar5 = 0;
  do {
    uVar2 = left[lVar4];
    uVar7 = uVar2 + uVar5 + right[lVar4];
    uVar6 = (ulong)(uVar7 < uVar2);
    if (uVar7 == uVar2) {
      uVar6 = uVar5;
    }
    result[lVar4] = uVar7;
    lVar4 = lVar4 + 1;
    uVar5 = uVar6;
  } while (lVar4 != 4);
  if (uVar6 == 0) {
    uVar3 = 3;
    do {
      uVar5 = mod[uVar3];
      uVar2 = result[uVar3];
      if (uVar2 >= uVar5 && uVar2 != uVar5) break;
      if (uVar2 < uVar5) {
        return;
      }
      bVar8 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar8);
  }
  lVar4 = 0;
  uVar5 = 0;
  do {
    uVar6 = mod[lVar4] + uVar5;
    puVar1 = result + lVar4;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - uVar6;
    if (uVar6 != 0) {
      uVar5 = (ulong)(uVar2 < uVar6);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

static void vli_modAdd(uECC_word_t *result,
                       const uECC_word_t *left,
                       const uECC_word_t *right,
                       const uECC_word_t *mod) {
    uECC_word_t carry = vli_add(result, left, right);
    if (carry || vli_cmp(result, mod) >= 0) {
        /* result > mod (result = mod + remainder), so subtract mod to get remainder. */
        vli_sub(result, result, mod);
    }
}